

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanced_geometry_device.h
# Opt level: O0

void embree::TutorialData_Constructor(TutorialData *This)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  pvVar1 = alignedUSMMalloc((size_t)This,(size_t)in_RDI,DEFAULT);
  in_RDI[3] = pvVar1;
  pvVar1 = alignedUSMMalloc((size_t)This,(size_t)in_RDI,DEFAULT);
  in_RDI[4] = pvVar1;
  pvVar1 = alignedUSMMalloc((size_t)This,(size_t)in_RDI,DEFAULT);
  in_RDI[5] = pvVar1;
  return;
}

Assistant:

void TutorialData_Constructor(TutorialData* This)
{
  This->g_scene  = nullptr;
  This->g_scene1 = nullptr;
  This->g_traversable = nullptr;
  This->instance_xfm = (AffineSpace3fa*) alignedUSMMalloc((4)*sizeof(AffineSpace3fa),16);
  This->normal_xfm = (LinearSpace3fa*) alignedUSMMalloc((4)*sizeof(LinearSpace3fa),16);
  This->colors = (Vec3fa*) alignedUSMMalloc((4*4)*sizeof(Vec3fa),16);
}